

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

CECoordinates * __thiscall
CECoordinates::GetObservedCoords
          (CECoordinates *this,double *julian_date,double *longitude,double *latitude,
          double *elevation_m,double *pressure_hPa,double *temperature_celsius,
          double *relative_humidity,double *dut1,double *xp,double *yp,double *wavelength)

{
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  CECoordinates *in_RDI;
  double in_R8;
  double *in_R9;
  double unaff_retaddr;
  double *in_stack_00000008;
  double *in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  double *in_stack_00000028;
  double *in_stack_00000030;
  undefined8 *in_stack_00000038;
  double in_stack_00000040;
  double in_stack_00000048;
  double in_stack_00000050;
  double in_stack_00000058;
  double in_stack_00000060;
  double in_stack_00000068;
  double in_stack_00000070;
  double *in_stack_00000080;
  double *in_stack_00000088;
  double observed3;
  double observed2;
  double observed1;
  double zenith;
  double azimuth;
  double in_stack_000000e0;
  double *in_stack_ffffffffffffff28;
  CEAngle *in_stack_ffffffffffffff30;
  CECoordinateType *in_stack_ffffffffffffff38;
  CEAngle *in_stack_ffffffffffffff40;
  CEAngle *in_stack_ffffffffffffff48;
  CECoordinates *in_stack_ffffffffffffff50;
  double *pdVar1;
  double *observed_dec;
  double *latitude_00;
  CECoordinates *pCVar2;
  
  observed_dec = (double *)0x0;
  pdVar1 = (double *)0x0;
  if (*(int *)(in_RSI + 5) == 0) {
    CEAngle::operator_cast_to_double((CEAngle *)(in_RSI + 1));
    CEAngle::operator_cast_to_double((CEAngle *)(in_RSI + 3));
    in_stack_ffffffffffffff28 = (double *)*in_stack_00000028;
    in_stack_ffffffffffffff30 = (CEAngle *)*in_stack_00000030;
    in_stack_ffffffffffffff38 = (CECoordinateType *)*in_stack_00000038;
    CIRS2Observed(in_stack_000000e0,(double)this,julian_date,longitude,(double)latitude,
                  (double)elevation_m,azimuth,zenith,observed1,observed2,(double)pressure_hPa,
                  (double)temperature_celsius,(double)relative_humidity,(double)dut1,(double)xp,
                  (double *)observed3,in_stack_00000088,in_stack_00000080);
  }
  else if (*(int *)(in_RSI + 5) == 1) {
    latitude_00 = in_RSI;
    pCVar2 = in_RDI;
    in_stack_ffffffffffffff50 =
         (CECoordinates *)CEAngle::operator_cast_to_double((CEAngle *)(in_RSI + 1));
    CEAngle::operator_cast_to_double((CEAngle *)(in_RSI + 3));
    in_stack_ffffffffffffff28 = (double *)*in_stack_00000028;
    in_stack_ffffffffffffff30 = (CEAngle *)*in_stack_00000030;
    in_stack_ffffffffffffff38 = (CECoordinateType *)*in_stack_00000038;
    ICRS2Observed(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                  unaff_retaddr,(double)pCVar2,(double)latitude_00,(double)in_RDX,(double)in_RCX,
                  in_R8,(double)in_stack_00000030,(double)in_stack_00000038,in_stack_00000040,
                  in_stack_00000048,in_stack_00000050,in_R9,observed_dec,pdVar1);
  }
  else if (*(int *)(in_RSI + 5) == 2) {
    pdVar1 = in_RSI;
    pCVar2 = in_RDI;
    in_stack_ffffffffffffff48 = (CEAngle *)CEAngle::operator_cast_to_double((CEAngle *)(in_RSI + 1))
    ;
    CEAngle::operator_cast_to_double((CEAngle *)(in_RSI + 3));
    in_stack_ffffffffffffff28 = (double *)*in_stack_00000028;
    in_stack_ffffffffffffff30 = (CEAngle *)*in_stack_00000030;
    in_stack_ffffffffffffff38 = (CECoordinateType *)*in_stack_00000038;
    Galactic2Observed(in_stack_00000040,(double)in_stack_00000038,in_stack_00000030,
                      in_stack_00000028,in_stack_00000020,in_stack_00000018,
                      (double)in_stack_00000010,(double)in_stack_00000008,unaff_retaddr,
                      (double)pCVar2,in_stack_00000050,in_stack_00000058,in_stack_00000060,
                      in_stack_00000068,in_stack_00000070,pdVar1,in_RDX,in_RCX);
  }
  else if (*(int *)(in_RSI + 5) == 3) {
    CEAngle::operator_cast_to_double((CEAngle *)(in_RSI + 1));
    CEAngle::operator_cast_to_double((CEAngle *)(in_RSI + 3));
  }
  CEAngle::CEAngle(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  CEAngle::CEAngle(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  CECoordinates(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                in_stack_ffffffffffffff38);
  CEAngle::~CEAngle((CEAngle *)0x128bca);
  CEAngle::~CEAngle((CEAngle *)0x128bd7);
  return in_RDI;
}

Assistant:

CECoordinates CECoordinates::GetObservedCoords(const double& julian_date,
                                const double& longitude,
                                const double& latitude,
                                const double& elevation_m,
                                const double& pressure_hPa,
                                const double& temperature_celsius,
                                const double& relative_humidity,
                                const double& dut1,
                                const double& xp, const double& yp,
                                const double& wavelength) const
{
    // Preliminary variables
    double azimuth(0);
    double zenith(0);
    double observed1(0);
    double observed2(0);
    double observed3(0);
    
    if (coord_type_ == CECoordinateType::CIRS) {
        // Convert CIRS to Observed
        CIRS2Observed(xcoord_, ycoord_, &azimuth, &zenith,
                      julian_date, longitude, latitude,
                      elevation_m, pressure_hPa, temperature_celsius,
                      relative_humidity, dut1, xp, yp, wavelength,
                      &observed1, &observed2, &observed3) ;
    } else if (coord_type_ == CECoordinateType::ICRS) {
        // Convert ICRS to Observed
        ICRS2Observed(xcoord_, ycoord_, &azimuth, &zenith,
                      julian_date, longitude, latitude,
                      elevation_m, pressure_hPa, temperature_celsius,
                      relative_humidity, dut1, xp, yp, wavelength,
                      &observed1, &observed2, &observed3) ;
    } else if (coord_type_ == CECoordinateType::GALACTIC) {
        // Convert Galactic to Observed
        Galactic2Observed(xcoord_, ycoord_, &azimuth, &zenith,
                          julian_date, longitude, latitude,
                          elevation_m, pressure_hPa, temperature_celsius,
                          relative_humidity, dut1, xp, yp, wavelength,
                          &observed1, &observed2, &observed3) ;
    } else if (coord_type_ == CECoordinateType::OBSERVED) {
        azimuth = xcoord_;
        zenith  = ycoord_; 
    }
    
    // Create the CECoordinates object to be returned
    return CECoordinates(azimuth, zenith, CECoordinateType::OBSERVED) ;
}